

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_add_filter_by_name.c
# Opt level: O0

int archive_write_add_filter_by_name(archive *a,char *name)

{
  int iVar1;
  int local_24;
  int i;
  char *name_local;
  archive *a_local;
  
  local_24 = 0;
  while( true ) {
    if (names[local_24].name == (char *)0x0) {
      archive_set_error(a,0x16,"No such filter \'%s\'",name);
      a->state = 0x8000;
      return -0x1e;
    }
    iVar1 = strcmp(name,names[local_24].name);
    if (iVar1 == 0) break;
    local_24 = local_24 + 1;
  }
  iVar1 = (*names[local_24].setter)(a);
  return iVar1;
}

Assistant:

int
archive_write_add_filter_by_name(struct archive *a, const char *name)
{
	int i;

	for (i = 0; names[i].name != NULL; i++) {
		if (strcmp(name, names[i].name) == 0)
			return ((names[i].setter)(a));
	}

	archive_set_error(a, EINVAL, "No such filter '%s'", name);
	a->state = ARCHIVE_STATE_FATAL;
	return (ARCHIVE_FATAL);
}